

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O0

Node * __thiscall
dynet::ScalarInputNode::autobatch_pseudo_node
          (ScalarInputNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  value_type vVar1;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *this_00;
  Dim *d;
  vector<float,_std::allocator<float>_> *pvVar2;
  const_reference pvVar3;
  const_reference ppNVar4;
  reference pvVar5;
  Node *pNVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RSI;
  size_t i;
  ScalarInputNode *sin;
  vector<float,_std::allocator<float>_> values;
  uint in_stack_0000012c;
  Dim *in_stack_00000130;
  undefined1 in_stack_00000138 [16];
  allocator_type *in_stack_ffffffffffffff50;
  vector<float,_std::allocator<float>_> *dat;
  InputNode *this_01;
  undefined4 local_94;
  undefined4 *local_90;
  undefined8 local_88;
  vector<float,_std::allocator<float>_> *local_58;
  value_type local_50;
  undefined1 local_31 [25];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  d = (Dim *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  this_01 = (InputNode *)local_31;
  std::allocator<float>::allocator((allocator<float> *)0xd541a3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)this_01,(size_type)d,in_stack_ffffffffffffff50
            );
  std::allocator<float>::~allocator((allocator<float> *)0xd541c9);
  local_58 = (vector<float,_std::allocator<float>_> *)0x0;
  while( true ) {
    dat = local_58;
    pvVar2 = (vector<float,_std::allocator<float>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
    this_00 = local_10;
    if (pvVar2 <= dat) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_18,(size_type)local_58);
    ppNVar4 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                        (this_00,(ulong)*pvVar3);
    local_50 = *ppNVar4;
    vVar1 = **(value_type **)(local_50[1].dim.d + 2);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_31 + 1),(size_type)local_58)
    ;
    *pvVar5 = vVar1;
    local_58 = (vector<float,_std::allocator<float>_> *)
               ((long)&(local_58->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  pNVar6 = (Node *)operator_new(0xa8);
  local_94 = 1;
  local_90 = &local_94;
  local_88 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
  Dim::Dim(in_stack_00000130,(initializer_list<unsigned_int>)in_stack_00000138,in_stack_0000012c);
  InputNode::InputNode(this_01,d,dat);
  std::vector<float,_std::allocator<float>_>::~vector(dat);
  return pNVar6;
}

Assistant:

Node* ScalarInputNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                             const std::vector<VariableIndex> & batch_ids) const {
  vector<float> values(batch_ids.size());
  ScalarInputNode* sin;
  for(size_t i = 0; i < batch_ids.size(); ++i) {
    sin = static_cast<ScalarInputNode*>(cg.nodes[batch_ids[i]]);
    values[i] = *sin->pdata;
  }
  return new InputNode(Dim({1}, batch_ids.size()), values);
}